

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

int nowide::utf::utf_traits<char,_1>::trail_length(char_type ci)

{
  int iVar1;
  
  if (-1 < ci) {
    return 0;
  }
  if ((byte)ci < 0xc2) {
    iVar1 = -1;
  }
  else if ((byte)ci < 0xe0) {
    iVar1 = 1;
  }
  else {
    if (0xef < (byte)ci) {
      return ((byte)ci < 0xf5) - 1 | 3;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int trail_length(char_type ci) 
        {
            unsigned char c = ci;
            if(c < 128)
                return 0;
            if(NOWIDE_UNLIKELY(c < 194))
                return -1;
            if(c < 224)
                return 1;
            if(c < 240)
                return 2;
            if(NOWIDE_LIKELY(c <=244))
                return 3;
            return -1;
        }